

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::CJoint::Prepare(CJoint *this,btScalar dt,int iterations)

{
  int iVar1;
  Joint *in_RDI;
  bool dodrift;
  btMatrix3x3 *in_stack_ffffffffffffff78;
  btScalar in_stack_ffffffffffffff88;
  btScalar in_stack_ffffffffffffff8c;
  btScalar in_stack_ffffffffffffff90;
  btScalar in_stack_ffffffffffffff94;
  btScalar bStack_68;
  btScalar local_64 [3];
  float local_58;
  btScalar local_54 [4];
  undefined1 local_44 [16];
  btScalar local_34 [4];
  undefined1 local_24 [19];
  undefined1 local_11;
  
  Joint::Prepare(in_RDI,(btScalar)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (int)in_stack_ffffffffffffff78);
  local_11 = *(int *)&in_RDI[1]._vptr_Joint == 0;
  iVar1 = *(int *)&in_RDI[1]._vptr_Joint + 1;
  *(int *)&in_RDI[1]._vptr_Joint = iVar1;
  in_RDI->m_delete = *(int *)((long)&in_RDI[1]._vptr_Joint + 4) < iVar1;
  if ((bool)local_11) {
    local_34 = (btScalar  [4])
               ::operator*((btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (btScalar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                          );
    local_24._0_16_ =
         (undefined1  [16])operator/((btVector3 *)in_RDI,(btScalar *)in_stack_ffffffffffffff78);
    *(undefined8 *)(in_RDI->m_drift).m_floats = local_24._0_8_;
    *(undefined8 *)((in_RDI->m_drift).m_floats + 2) = local_24._8_8_;
    if (0.0 < in_RDI->m_split) {
      in_stack_ffffffffffffff78 = &in_RDI->m_massmatrix;
      local_54 = (btScalar  [4])
                 ::operator*((btVector3 *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             (btScalar *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_44 = (undefined1  [16])
                 ::operator*((btMatrix3x3 *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             (btVector3 *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      *(undefined8 *)(in_RDI->m_sdrift).m_floats = local_44._0_8_;
      *(undefined8 *)((in_RDI->m_sdrift).m_floats + 2) = local_44._8_8_;
      local_58 = 1.0 - in_RDI->m_split;
      btVector3::operator*=(&in_RDI->m_drift,&local_58);
    }
    btVector3::operator/=((btVector3 *)in_RDI,(btScalar *)in_stack_ffffffffffffff78);
  }
  else {
    btVector3::btVector3
              ((btVector3 *)&stack0xffffffffffffff94,(btScalar *)&stack0xffffffffffffff90,
               (btScalar *)&stack0xffffffffffffff8c,(btScalar *)&stack0xffffffffffffff88);
    *(ulong *)(in_RDI->m_sdrift).m_floats = CONCAT44(bStack_68,in_stack_ffffffffffffff94);
    *(undefined8 *)((in_RDI->m_sdrift).m_floats + 2) = local_64._0_8_;
    *(undefined8 *)(in_RDI->m_drift).m_floats = *(undefined8 *)(in_RDI->m_sdrift).m_floats;
    *(undefined8 *)((in_RDI->m_drift).m_floats + 2) =
         *(undefined8 *)((in_RDI->m_sdrift).m_floats + 2);
  }
  return;
}

Assistant:

void				btSoftBody::CJoint::Prepare(btScalar dt,int iterations)
{
	Joint::Prepare(dt,iterations);
	const bool	dodrift=(m_life==0);
	m_delete=(++m_life)>m_maxlife;
	if(dodrift)
	{
		m_drift=m_drift*m_erp/dt;
		if(m_split>0)
		{
			m_sdrift	=	m_massmatrix*(m_drift*m_split);
			m_drift		*=	1-m_split;
		}
		m_drift/=(btScalar)iterations;
	}
	else
	{
		m_drift=m_sdrift=btVector3(0,0,0);
	}
}